

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
cppcms::application::render
          (application *this,string *skin,string *template_name,base_content *content)

{
  ostream *this_00;
  app_guard g;
  response *in_stack_000000f8;
  base_content *in_stack_00000100;
  ostream *in_stack_00000108;
  string *in_stack_00000110;
  string *in_stack_00000118;
  manager *in_stack_00000120;
  application *in_stack_ffffffffffffff90;
  base_content *in_stack_ffffffffffffff98;
  app_guard *in_stack_ffffffffffffffa0;
  
  base_content::app_guard::app_guard
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  service((application *)0x3b0f05);
  cppcms::service::views_pool((service *)0x3b0f16);
  response((application *)0x3b0f27);
  this_00 = http::response::out(in_stack_000000f8);
  views::manager::render
            (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108,
             in_stack_00000100);
  base_content::app_guard::~app_guard((app_guard *)this_00);
  return;
}

Assistant:

void application::render(std::string skin,std::string template_name,base_content &content)
{
	base_content::app_guard g(content,*this);
	service().views_pool().render(skin,template_name,response().out(),content);
}